

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

tchar_t * tcscpy_s(tchar_t *Out,size_t OutLen,tchar_t *In)

{
  size_t sVar1;
  ulong __n;
  
  if (In != (tchar_t *)0x0) {
    if (OutLen != 0) {
      sVar1 = strlen(In);
      __n = OutLen - 1;
      if (sVar1 < OutLen - 1) {
        __n = sVar1;
      }
      memcpy(Out,In,__n);
      Out[__n] = '\0';
    }
    return Out;
  }
  __assert_fail("In != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/str/str.c"
                ,0x60,"tchar_t *tcscpy_s(tchar_t *, size_t, const tchar_t *)");
}

Assistant:

tchar_t* tcscpy_s(tchar_t* Out,size_t OutLen,const tchar_t* In)
{
    assert(In != NULL);
	if (OutLen>0)
	{
		size_t n = MIN(tcslen(In),OutLen-1);
		memcpy(Out,In,n*sizeof(tchar_t));
		Out[n] = 0;
	}
    return Out;
}